

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.h
# Opt level: O1

void __thiscall wallet::CWalletTx::Unserialize<DataStream>(CWalletTx *this,DataStream *s)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  __index_type _Var4;
  uint uVar5;
  iterator iVar6;
  long lVar7;
  int iVar8;
  size_t in_RCX;
  size_t __nbytes;
  uchar uVar9;
  long in_FS_OFFSET;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  pVar14;
  string_view str;
  string_view str_00;
  vector<wallet::CMerkleTx,_std::allocator<wallet::CMerkleTx>_> dummy_vector2;
  vector<uint256,_std::allocator<uint256>_> dummy_vector1;
  uint256 serialized_block_hash;
  uint32_t obj;
  vector<wallet::CMerkleTx,_std::allocator<wallet::CMerkleTx>_> local_d8;
  vector<uint256,_std::allocator<uint256>_> local_b8;
  undefined8 local_98;
  undefined7 uStack_90;
  uchar uStack_89;
  undefined7 uStack_88;
  undefined8 uStack_81;
  uchar local_78;
  uchar uStack_77;
  uchar uStack_76;
  uchar uStack_75;
  uchar uStack_74;
  uchar uStack_73;
  uchar uStack_72;
  uchar uStack_71;
  uchar uStack_70;
  uchar uStack_6f;
  uchar uStack_6e;
  uchar uStack_6d;
  uchar uStack_6c;
  uchar uStack_6b;
  uchar uStack_6a;
  uchar uStack_69;
  uchar local_68;
  uchar uStack_67;
  uchar uStack_66;
  uchar uStack_65;
  uchar uStack_64;
  uchar uStack_63;
  uchar uStack_62;
  uchar uStack_61;
  undefined8 uStack_60;
  key_type local_58;
  int local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)this);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_M_erase_at_end(&this->vOrderForm,
                    (this->vOrderForm).
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  this->fChangeCached = false;
  this->nChangeCached = 0;
  this->fTimeReceivedIsTxTime = 0;
  this->nTimeReceived = 0;
  *(undefined8 *)((long)&this->nTimeReceived + 1) = 0;
  this->nOrderPos = -1;
  local_b8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_b8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_b8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_d8.super__Vector_base<wallet::CMerkleTx,_std::allocator<wallet::CMerkleTx>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.super__Vector_base<wallet::CMerkleTx,_std::allocator<wallet::CMerkleTx>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.super__Vector_base<wallet::CMerkleTx,_std::allocator<wallet::CMerkleTx>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68 = '\0';
  uStack_67 = '\0';
  uStack_66 = '\0';
  uStack_65 = '\0';
  uStack_64 = '\0';
  uStack_63 = '\0';
  uStack_62 = '\0';
  uStack_61 = '\0';
  uStack_60 = 0;
  local_78 = '\0';
  uStack_77 = '\0';
  uStack_76 = '\0';
  uStack_75 = '\0';
  uStack_74 = '\0';
  uStack_73 = '\0';
  uStack_72 = '\0';
  uStack_71 = '\0';
  uStack_70 = '\0';
  uStack_6f = '\0';
  uStack_6e = '\0';
  uStack_6d = '\0';
  uStack_6c = '\0';
  uStack_6b = '\0';
  uStack_6a = '\0';
  uStack_69 = '\0';
  local_58._M_dataplus._M_p = &TX_WITH_WITNESS.allow_witness;
  local_58._M_string_length = (size_type)s;
  Unserialize<ParamsStream<DataStream&,TransactionSerParams>,CTransaction>
            ((ParamsStream<DataStream_&,_TransactionSerParams> *)&local_58,&this->tx);
  DataStream::read(s,(int)&local_78,(void *)0x20,in_RCX);
  VectorFormatter<DefaultFormatter>::Unser<DataStream,std::vector<uint256,std::allocator<uint256>>>
            ((VectorFormatter<DefaultFormatter> *)&local_58,s,&local_b8);
  DataStream::read(s,(int)&local_58,(void *)0x4,in_RCX);
  iVar3 = (uint)local_58._M_dataplus._M_p;
  VectorFormatter<DefaultFormatter>::
  Unser<DataStream,std::vector<wallet::CMerkleTx,std::allocator<wallet::CMerkleTx>>>
            ((VectorFormatter<DefaultFormatter> *)&local_58,s,&local_d8);
  Unserialize<DataStream,std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            (s,&this->mapValue);
  VectorFormatter<DefaultFormatter>::
  Unser<DataStream,std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>>
            ((VectorFormatter<DefaultFormatter> *)&local_58,s,&this->vOrderForm);
  DataStream::read(s,(int)&local_58,(void *)0x4,in_RCX);
  __nbytes = (ulong)local_58._M_dataplus._M_p & 0xffffffff;
  this->fTimeReceivedIsTxTime = (uint)local_58._M_dataplus._M_p;
  DataStream::read(s,(int)&local_58,(void *)0x4,__nbytes);
  this->nTimeReceived = (uint)local_58._M_dataplus._M_p;
  DataStream::read(s,(int)&local_58,(void *)0x1,__nbytes);
  this->fFromMe = (char)local_58._M_dataplus._M_p != '\0';
  DataStream::read(s,(int)&local_58,(void *)0x1,__nbytes);
  iVar8 = (int)__nbytes;
  local_58.field_2._M_local_buf[0] = local_68;
  local_58.field_2._M_local_buf[1] = uStack_67;
  local_58.field_2._M_local_buf[2] = uStack_66;
  local_58.field_2._M_local_buf[3] = uStack_65;
  local_58.field_2._M_local_buf[4] = uStack_64;
  local_58.field_2._M_local_buf[5] = uStack_63;
  local_58.field_2._M_local_buf[6] = uStack_62;
  local_58.field_2._M_local_buf[7] = uStack_61;
  local_58.field_2._M_local_buf[8] = (uchar)uStack_60;
  local_58.field_2._M_local_buf[9] = uStack_60._1_1_;
  local_58.field_2._M_local_buf[10] = uStack_60._2_1_;
  local_58.field_2._M_local_buf[0xb] = uStack_60._3_1_;
  local_58.field_2._M_local_buf[0xc] = uStack_60._4_1_;
  local_58.field_2._M_local_buf[0xd] = uStack_60._5_1_;
  local_58.field_2._M_local_buf[0xe] = uStack_60._6_1_;
  local_58.field_2._M_local_buf[0xf] = uStack_60._7_1_;
  local_58._M_string_length =
       CONCAT17(uStack_69,
                CONCAT16(uStack_6a,
                         CONCAT15(uStack_6b,
                                  CONCAT14(uStack_6c,
                                           CONCAT13(uStack_6d,
                                                    CONCAT12(uStack_6e,CONCAT11(uStack_6f,uStack_70)
                                                            ))))));
  local_38 = iVar3;
  auVar13[0] = -(local_68 == '\0');
  auVar13[1] = -(uStack_67 == '\0');
  auVar13[2] = -(uStack_66 == '\0');
  auVar13[3] = -(uStack_65 == '\0');
  auVar13[4] = -(uStack_64 == '\0');
  auVar13[5] = -(uStack_63 == '\0');
  auVar13[6] = -(uStack_62 == '\0');
  auVar13[7] = -(uStack_61 == '\0');
  auVar13[8] = -((uchar)uStack_60 == '\0');
  auVar13[9] = -(uStack_60._1_1_ == '\0');
  auVar13[10] = -(uStack_60._2_1_ == '\0');
  auVar13[0xb] = -(uStack_60._3_1_ == '\0');
  auVar13[0xc] = -(uStack_60._4_1_ == '\0');
  auVar13[0xd] = -(uStack_60._5_1_ == '\0');
  auVar13[0xe] = -(uStack_60._6_1_ == '\0');
  auVar13[0xf] = -(uStack_60._7_1_ == '\0');
  auVar12[0] = -(local_78 == '\0');
  auVar12[1] = -(uStack_77 == '\0');
  auVar12[2] = -(uStack_76 == '\0');
  auVar12[3] = -(uStack_75 == '\0');
  auVar12[4] = -(uStack_74 == '\0');
  auVar12[5] = -(uStack_73 == '\0');
  auVar12[6] = -(uStack_72 == '\0');
  auVar12[7] = -(uStack_71 == '\0');
  auVar12[8] = -(uStack_70 == '\0');
  auVar12[9] = -(uStack_6f == '\0');
  auVar12[10] = -(uStack_6e == '\0');
  auVar12[0xb] = -(uStack_6d == '\0');
  auVar12[0xc] = -(uStack_6c == '\0');
  auVar12[0xd] = -(uStack_6b == '\0');
  auVar12[0xe] = -(uStack_6a == '\0');
  auVar12[0xf] = -(uStack_69 == '\0');
  auVar12 = auVar12 & auVar13;
  if ((ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) | (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar12[0xf] >> 7) << 0xf) == 0xffff) {
    if (iVar3 == 0) {
      uVar9 = '\0';
LAB_001bc671:
      _Var4 = '\x03';
      goto LAB_001bc69f;
    }
LAB_001bc67c:
    _Var4 = '\x04';
    iVar8 = iVar3;
  }
  else {
    auVar11[0] = -(local_68 == '\0');
    auVar11[1] = -(uStack_67 == '\0');
    auVar11[2] = -(uStack_66 == '\0');
    auVar11[3] = -(uStack_65 == '\0');
    auVar11[4] = -(uStack_64 == '\0');
    auVar11[5] = -(uStack_63 == '\0');
    auVar11[6] = -(uStack_62 == '\0');
    auVar11[7] = -(uStack_61 == '\0');
    auVar11[8] = -((uchar)uStack_60 == '\0');
    auVar11[9] = -(uStack_60._1_1_ == '\0');
    auVar11[10] = -(uStack_60._2_1_ == '\0');
    auVar11[0xb] = -(uStack_60._3_1_ == '\0');
    auVar11[0xc] = -(uStack_60._4_1_ == '\0');
    auVar11[0xd] = -(uStack_60._5_1_ == '\0');
    auVar11[0xe] = -(uStack_60._6_1_ == '\0');
    auVar11[0xf] = -(uStack_60._7_1_ == '\0');
    auVar10[0] = -(local_78 == '\x01');
    auVar10[1] = -(uStack_77 == '\0');
    auVar10[2] = -(uStack_76 == '\0');
    auVar10[3] = -(uStack_75 == '\0');
    auVar10[4] = -(uStack_74 == '\0');
    auVar10[5] = -(uStack_73 == '\0');
    auVar10[6] = -(uStack_72 == '\0');
    auVar10[7] = -(uStack_71 == '\0');
    auVar10[8] = -(uStack_70 == '\0');
    auVar10[9] = -(uStack_6f == '\0');
    auVar10[10] = -(uStack_6e == '\0');
    auVar10[0xb] = -(uStack_6d == '\0');
    auVar10[0xc] = -(uStack_6c == '\0');
    auVar10[0xd] = -(uStack_6b == '\0');
    auVar10[0xe] = -(uStack_6a == '\0');
    auVar10[0xf] = -(uStack_69 == '\0');
    auVar10 = auVar10 & auVar11;
    if ((ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) | (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar10[0xf] >> 7) << 0xf) == 0xffff) {
      if (iVar3 == -1) {
        uVar9 = '\x01';
        goto LAB_001bc671;
      }
      goto LAB_001bc67c;
    }
    iVar8 = -1;
    if (iVar3 < 0) {
      if (iVar3 != -1) goto LAB_001bc67c;
      _Var4 = '\x02';
    }
    else {
      _Var4 = '\0';
    }
  }
  local_98 = CONCAT17(uStack_70,
                      CONCAT16(uStack_71,
                               CONCAT15(uStack_72,
                                        CONCAT14(uStack_73,
                                                 CONCAT13(uStack_74,
                                                          CONCAT12(uStack_75,
                                                                   CONCAT11(uStack_76,uStack_77)))))
                              ));
  uStack_90 = CONCAT16(uStack_69,
                       CONCAT15(uStack_6a,
                                CONCAT14(uStack_6b,
                                         CONCAT13(uStack_6c,
                                                  CONCAT12(uStack_6d,CONCAT11(uStack_6e,uStack_6f)))
                                        )));
  uStack_89 = local_68;
  uStack_88 = (undefined7)
              (CONCAT17(uStack_61,
                        CONCAT16(uStack_62,
                                 CONCAT15(uStack_63,
                                          CONCAT14(uStack_64,
                                                   CONCAT13(uStack_65,
                                                            CONCAT12(uStack_66,
                                                                     CONCAT11(uStack_67,local_68))))
                                         ))) >> 8);
  uStack_81 = uStack_60;
  uVar9 = local_78;
LAB_001bc69f:
  *(uchar *)&(this->m_state).
             super__Variant_base<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
             .
             super__Move_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
             .
             super__Copy_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
             .
             super__Move_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
             .
             super__Copy_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
             .
             super__Variant_storage_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
             ._M_u = uVar9;
  *(undefined8 *)
   ((long)&(this->m_state).
           super__Variant_base<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
           .
           super__Move_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
           .
           super__Copy_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
           .
           super__Move_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
           .
           super__Copy_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
           .
           super__Variant_storage_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
   + 1) = local_98;
  *(ulong *)((long)&(this->m_state).
                    super__Variant_base<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                    .
                    super__Move_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                    .
                    super__Copy_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                    .
                    super__Move_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                    .
                    super__Copy_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                    .
                    super__Variant_storage_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
            + 9) = CONCAT17(uStack_89,uStack_90);
  *(ulong *)((long)&(this->m_state).
                    super__Variant_base<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                    .
                    super__Move_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                    .
                    super__Copy_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                    .
                    super__Move_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                    .
                    super__Copy_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                    .
                    super__Variant_storage_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
            + 0x10) = CONCAT71(uStack_88,uStack_89);
  *(undefined8 *)
   ((long)&(this->m_state).
           super__Variant_base<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
           .
           super__Move_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
           .
           super__Copy_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
           .
           super__Move_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
           .
           super__Copy_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
           .
           super__Variant_storage_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
   + 0x18) = uStack_81;
  *(int *)((long)&(this->m_state).
                  super__Variant_base<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                  .
                  super__Move_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                  .
                  super__Copy_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                  .
                  super__Move_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                  .
                  super__Copy_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                  .
                  super__Variant_storage_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
          + 0x20) = iVar8;
  *(int *)((long)&(this->m_state).
                  super__Variant_base<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                  .
                  super__Move_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                  .
                  super__Copy_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                  .
                  super__Move_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                  .
                  super__Copy_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                  .
                  super__Variant_storage_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
          + 0x24) = iVar3;
  *(__index_type *)
   ((long)&(this->m_state).
           super__Variant_base<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
           .
           super__Move_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
           .
           super__Copy_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
           .
           super__Move_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
           .
           super__Copy_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
           .
           super__Variant_storage_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
   + 0x28) = _Var4;
  paVar2 = &local_58.field_2;
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"n","");
  iVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)this,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT17(local_58.field_2._M_local_buf[7],
                             CONCAT16(local_58.field_2._M_local_buf[6],
                                      CONCAT15(local_58.field_2._M_local_buf[5],
                                               CONCAT14(local_58.field_2._M_local_buf[4],
                                                        CONCAT13(local_58.field_2._M_local_buf[3],
                                                                 CONCAT12(local_58.field_2.
                                                                          _M_local_buf[2],
                                                                          CONCAT11(local_58.field_2.
                                                                                   _M_local_buf[1],
                                                                                   local_58.field_2.
                                                                                   _M_local_buf[0]))
                                                                ))))) + 1);
  }
  p_Var1 = &(this->mapValue)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar6._M_node == p_Var1) {
    lVar7 = -1;
  }
  else {
    str._M_str = *(char **)(iVar6._M_node + 2);
    str._M_len = (size_t)iVar6._M_node[2]._M_parent;
    lVar7 = LocaleIndependentAtoi<long>(str);
  }
  this->nOrderPos = lVar7;
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"timesmart","");
  iVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)this,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT17(local_58.field_2._M_local_buf[7],
                             CONCAT16(local_58.field_2._M_local_buf[6],
                                      CONCAT15(local_58.field_2._M_local_buf[5],
                                               CONCAT14(local_58.field_2._M_local_buf[4],
                                                        CONCAT13(local_58.field_2._M_local_buf[3],
                                                                 CONCAT12(local_58.field_2.
                                                                          _M_local_buf[2],
                                                                          CONCAT11(local_58.field_2.
                                                                                   _M_local_buf[1],
                                                                                   local_58.field_2.
                                                                                   _M_local_buf[0]))
                                                                ))))) + 1);
  }
  if ((_Rb_tree_header *)iVar6._M_node == p_Var1) {
    uVar5 = 0;
  }
  else {
    str_00._M_str = *(char **)(iVar6._M_node + 2);
    str_00._M_len = (size_t)iVar6._M_node[2]._M_parent;
    lVar7 = LocaleIndependentAtoi<long>(str_00);
    uVar5 = (uint)lVar7;
  }
  this->nTimeSmart = uVar5;
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"fromaccount","");
  pVar14 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::equal_range((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)this,&local_58);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_M_erase_aux((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)this,(_Base_ptr)pVar14.first._M_node,(_Base_ptr)pVar14.second._M_node);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT17(local_58.field_2._M_local_buf[7],
                             CONCAT16(local_58.field_2._M_local_buf[6],
                                      CONCAT15(local_58.field_2._M_local_buf[5],
                                               CONCAT14(local_58.field_2._M_local_buf[4],
                                                        CONCAT13(local_58.field_2._M_local_buf[3],
                                                                 CONCAT12(local_58.field_2.
                                                                          _M_local_buf[2],
                                                                          CONCAT11(local_58.field_2.
                                                                                   _M_local_buf[1],
                                                                                   local_58.field_2.
                                                                                   _M_local_buf[0]))
                                                                ))))) + 1);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"spent","");
  pVar14 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::equal_range((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)this,&local_58);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_M_erase_aux((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)this,(_Base_ptr)pVar14.first._M_node,(_Base_ptr)pVar14.second._M_node);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT17(local_58.field_2._M_local_buf[7],
                             CONCAT16(local_58.field_2._M_local_buf[6],
                                      CONCAT15(local_58.field_2._M_local_buf[5],
                                               CONCAT14(local_58.field_2._M_local_buf[4],
                                                        CONCAT13(local_58.field_2._M_local_buf[3],
                                                                 CONCAT12(local_58.field_2.
                                                                          _M_local_buf[2],
                                                                          CONCAT11(local_58.field_2.
                                                                                   _M_local_buf[1],
                                                                                   local_58.field_2.
                                                                                   _M_local_buf[0]))
                                                                ))))) + 1);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"n","");
  pVar14 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::equal_range((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)this,&local_58);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_M_erase_aux((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)this,(_Base_ptr)pVar14.first._M_node,(_Base_ptr)pVar14.second._M_node);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT17(local_58.field_2._M_local_buf[7],
                             CONCAT16(local_58.field_2._M_local_buf[6],
                                      CONCAT15(local_58.field_2._M_local_buf[5],
                                               CONCAT14(local_58.field_2._M_local_buf[4],
                                                        CONCAT13(local_58.field_2._M_local_buf[3],
                                                                 CONCAT12(local_58.field_2.
                                                                          _M_local_buf[2],
                                                                          CONCAT11(local_58.field_2.
                                                                                   _M_local_buf[1],
                                                                                   local_58.field_2.
                                                                                   _M_local_buf[0]))
                                                                ))))) + 1);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"timesmart","");
  pVar14 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::equal_range((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)this,&local_58);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_M_erase_aux((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)this,(_Base_ptr)pVar14.first._M_node,(_Base_ptr)pVar14.second._M_node);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT17(local_58.field_2._M_local_buf[7],
                             CONCAT16(local_58.field_2._M_local_buf[6],
                                      CONCAT15(local_58.field_2._M_local_buf[5],
                                               CONCAT14(local_58.field_2._M_local_buf[4],
                                                        CONCAT13(local_58.field_2._M_local_buf[3],
                                                                 CONCAT12(local_58.field_2.
                                                                          _M_local_buf[2],
                                                                          CONCAT11(local_58.field_2.
                                                                                   _M_local_buf[1],
                                                                                   local_58.field_2.
                                                                                   _M_local_buf[0]))
                                                                ))))) + 1);
  }
  if (local_d8.super__Vector_base<wallet::CMerkleTx,_std::allocator<wallet::CMerkleTx>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.
                    super__Vector_base<wallet::CMerkleTx,_std::allocator<wallet::CMerkleTx>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_d8.
                          super__Vector_base<wallet::CMerkleTx,_std::allocator<wallet::CMerkleTx>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.
                          super__Vector_base<wallet::CMerkleTx,_std::allocator<wallet::CMerkleTx>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_b8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_b8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Unserialize(Stream& s)
    {
        Init();

        std::vector<uint256> dummy_vector1; //!< Used to be vMerkleBranch
        std::vector<CMerkleTx> dummy_vector2; //!< Used to be vtxPrev
        bool dummy_bool; //! Used to be fSpent
        uint256 serialized_block_hash;
        int serializedIndex;
        s >> TX_WITH_WITNESS(tx) >> serialized_block_hash >> dummy_vector1 >> serializedIndex >> dummy_vector2 >> mapValue >> vOrderForm >> fTimeReceivedIsTxTime >> nTimeReceived >> fFromMe >> dummy_bool;

        m_state = TxStateInterpretSerialized({serialized_block_hash, serializedIndex});

        const auto it_op = mapValue.find("n");
        nOrderPos = (it_op != mapValue.end()) ? LocaleIndependentAtoi<int64_t>(it_op->second) : -1;
        const auto it_ts = mapValue.find("timesmart");
        nTimeSmart = (it_ts != mapValue.end()) ? static_cast<unsigned int>(LocaleIndependentAtoi<int64_t>(it_ts->second)) : 0;

        mapValue.erase("fromaccount");
        mapValue.erase("spent");
        mapValue.erase("n");
        mapValue.erase("timesmart");
    }